

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setAccessibleIdentifier(QWidget *this,QString *identifier)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  code *local_48;
  undefined8 uStack_40;
  QWidget *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = (identifier->d).size;
  if (*(long *)(lVar1 + 0x178) == lVar2) {
    QVar4.m_data = *(storage_type_conflict **)(lVar1 + 0x170);
    QVar4.m_size = *(long *)(lVar1 + 0x178);
    QVar5.m_data = (identifier->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') goto LAB_0030f26e;
  }
  QString::operator=((QString *)(lVar1 + 0x168),(QString *)identifier);
  local_48 = QFont::strikeOut;
  uStack_40 = 0xaaaaaaaa000080e0;
  uStack_30 = 0xaaaaaaaaffffffff;
  local_38 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
LAB_0030f26e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setAccessibleIdentifier(const QString &identifier)
{
    Q_D(QWidget);
    if (d->accessibleIdentifier == identifier)
        return;

    d->accessibleIdentifier = identifier;
    QAccessibleEvent event(this, QAccessible::IdentifierChanged);
    QAccessible::updateAccessibility(&event);
}